

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

bool __thiscall
Assimp::X3DImporter::FindNodeElement_FromRoot
          (X3DImporter *this,string *pID,EType pType,CX3DImporter_NodeElement **pElement)

{
  pointer __s2;
  size_t __n;
  CX3DImporter_NodeElement *pCVar1;
  int iVar2;
  _List_node_base *p_Var3;
  
  p_Var3 = (this->NodeElement_List).
           super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)&this->NodeElement_List) {
    __s2 = (pID->_M_dataplus)._M_p;
    __n = pID->_M_string_length;
    do {
      pCVar1 = (CX3DImporter_NodeElement *)p_Var3[1]._M_next;
      if (((pCVar1->Type == pType) && ((pCVar1->ID)._M_string_length == __n)) &&
         ((__n == 0 || (iVar2 = bcmp((pCVar1->ID)._M_dataplus._M_p,__s2,__n), iVar2 == 0)))) {
        if (pElement == (CX3DImporter_NodeElement **)0x0) {
          return true;
        }
        *pElement = pCVar1;
        return true;
      }
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)&this->NodeElement_List);
  }
  return false;
}

Assistant:

bool X3DImporter::FindNodeElement_FromRoot(const std::string& pID, const CX3DImporter_NodeElement::EType pType, CX3DImporter_NodeElement** pElement)
{
	for(std::list<CX3DImporter_NodeElement*>::iterator it = NodeElement_List.begin(); it != NodeElement_List.end(); ++it)
	{
		if(((*it)->Type == pType) && ((*it)->ID == pID))
		{
			if(pElement != nullptr) *pElement = *it;

			return true;
		}
	}// for(std::list<CX3DImporter_NodeElement*>::iterator it = NodeElement_List.begin(); it != NodeElement_List.end(); it++)

	return false;
}